

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

DdNode * cuddLocalCacheLookup(DdLocalCache *cache,DdNodePtr *key)

{
  uint uVar1;
  int iVar2;
  ulong *puVar3;
  DdNode *value;
  DdLocalCacheItem *entry;
  uint posn;
  DdNodePtr *key_local;
  DdLocalCache *cache_local;
  
  cache->lookUps = cache->lookUps + 1.0;
  uVar1 = ddLCHash(key,cache->keysize,cache->shift);
  puVar3 = (ulong *)((long)cache->item->key + ((ulong)(uVar1 * cache->itemsize) - 8));
  if ((*puVar3 != 0) && (iVar2 = memcmp(key,puVar3 + 1,(ulong)cache->keysize << 3), iVar2 == 0)) {
    cache->hits = cache->hits + 1.0;
    if (((DdNode *)(*puVar3 & 0xfffffffffffffffe))->ref == 0) {
      cuddReclaim(cache->manager,(DdNode *)(*puVar3 & 0xfffffffffffffffe));
    }
    return (DdNode *)*puVar3;
  }
  if ((cache->slots < cache->maxslots) && (cache->lookUps * cache->minHit < cache->hits)) {
    cuddLocalCacheResize(cache);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddLocalCacheLookup(
  DdLocalCache * cache,
  DdNodePtr * key)
{
    unsigned int posn;
    DdLocalCacheItem *entry;
    DdNode *value;

    cache->lookUps++;
    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    if (entry->value != NULL &&
        memcmp(key,entry->key,cache->keysize*sizeof(DdNode *)) == 0) {
        cache->hits++;
        value = Cudd_Regular(entry->value);
        if (value->ref == 0) {
            cuddReclaim(cache->manager,value);
        }
        return(entry->value);
    }

    /* Cache miss: decide whether to resize */

    if (cache->slots < cache->maxslots &&
        cache->hits > cache->lookUps * cache->minHit) {
        cuddLocalCacheResize(cache);
    }

    return(NULL);

}